

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecordUsageCache.h
# Opt level: O0

bool __thiscall
Js::PropertyRecordUsageCache::TrySetPropertyFromCache<false>
          (PropertyRecordUsageCache *this,RecyclableObject *object,Var propertyValue,
          ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags,
          PropertyValueInfo *propertyValueInfo,RecyclableObject *owner,
          PropertyCacheOperationInfo *operationInfo)

{
  bool bVar1;
  PropertyId propertyId;
  uint uVar2;
  PropertyRecord *this_00;
  char16 *pcVar3;
  Type *pTVar4;
  PolymorphicInlineCache *pPVar5;
  Type *type;
  bool found;
  PropertyValueInfo *propertyValueInfo_local;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *requestContext_local;
  Var propertyValue_local;
  RecyclableObject *object_local;
  PropertyRecordUsageCache *this_local;
  
  bVar1 = ShouldUseCache(this);
  if (bVar1) {
    pPVar5 = GetStElemInlineCache(this);
    PropertyValueInfo::SetCacheInfo(propertyValueInfo,owner,this,pPVar5,true);
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->(&this->propertyRecord);
    propertyId = PropertyRecord::GetPropertyId(this_00);
    bVar1 = CacheOperators::TrySetProperty<true,true,true,true,true,false,true,false>
                      (object,false,propertyId,propertyValue,requestContext,propertyOperationFlags,
                       operationInfo,propertyValueInfo);
    if (bVar1) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PropertyCachePhase);
      if (bVar1) {
        pcVar3 = GetString(this);
        pTVar4 = RecyclableObject::GetType(object);
        Output::Print(L"PropertyCache: SetElem cache hit for \'%s\': type %p\n",pcVar3,pTVar4);
      }
      RegisterCacheHit(this);
      return true;
    }
  }
  RegisterCacheMiss(this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PropertyCachePhase);
  if (bVar1) {
    pcVar3 = GetString(this);
    pTVar4 = RecyclableObject::GetType(object);
    pPVar5 = GetStElemInlineCache(this);
    type = RecyclableObject::GetType(object);
    uVar2 = PolymorphicInlineCache::GetInlineCacheIndexForType(pPVar5,type);
    Output::Print(L"PropertyCache: SetElem cache miss for \'%s\': type %p, index %d\n",pcVar3,pTVar4
                  ,(ulong)uVar2);
    DumpCache(this,false);
  }
  return false;
}

Assistant:

inline bool PropertyRecordUsageCache::TrySetPropertyFromCache(
        _In_ RecyclableObject *const object,
        _In_ Var propertyValue,
        _In_ ScriptContext *const requestContext,
        const PropertyOperationFlags propertyOperationFlags,
        _Out_ PropertyValueInfo *const propertyValueInfo,
        _In_ RecyclableObject *const owner, // Object that this usage cache is part of
        _Out_opt_ PropertyCacheOperationInfo* operationInfo)
    {
        if (ShouldUseCache())
        {
            PropertyValueInfo::SetCacheInfo(propertyValueInfo, owner, this, GetStElemInlineCache(), true /* allowResizing */);
            bool found = CacheOperators::TrySetProperty<
                true,   // CheckLocal
                true,   // CheckLocalTypeWithoutProperty
                true,   // CheckAccessor
                true,   // CheckPolymorphicInlineCache
                true,   // CheckTypePropertyCache
                false,  // IsInlineCacheAvailable
                true,   // IsPolymorphicInlineCacheAvailable
                ReturnOperationInfo>
                (object,
                    false, // isRoot
                    this->propertyRecord->GetPropertyId(),
                    propertyValue,
                    requestContext,
                    propertyOperationFlags,
                    operationInfo,
                    propertyValueInfo);

            if (found)
            {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                if (PHASE_TRACE1(PropertyCachePhase))
                {
                    Output::Print(_u("PropertyCache: SetElem cache hit for '%s': type %p\n"), GetString(), object->GetType());
                }
#endif
                RegisterCacheHit();
                return true;
            }
        }
        RegisterCacheMiss();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE1(PropertyCachePhase))
        {
            Output::Print(_u("PropertyCache: SetElem cache miss for '%s': type %p, index %d\n"),
                GetString(),
                object->GetType(),
                GetStElemInlineCache()->GetInlineCacheIndexForType(object->GetType()));
            DumpCache(false);
        }
#endif
        return false;
    }